

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O2

void jpc_mqenc_init(jpc_mqenc_t *mqenc)

{
  mqenc->areg = 0x8000;
  mqenc->outbuf = -1;
  mqenc->creg = 0;
  mqenc->ctreg = 0xc;
  mqenc->lastbyte = -1;
  mqenc->err = 0;
  return;
}

Assistant:

void jpc_mqenc_init(jpc_mqenc_t *mqenc)
{
	mqenc->areg = 0x8000;
	mqenc->outbuf = -1;
	mqenc->creg = 0;
	mqenc->ctreg = 12;
	mqenc->lastbyte = -1;
	mqenc->err = 0;
}